

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

uint __thiscall
flatbuffers::FlatBufferBuilderImpl<true>::PushElement<float,unsigned_int>
          (FlatBufferBuilderImpl<true> *this,float element)

{
  type tVar1;
  float local_18;
  float local_14;
  FlatBufferBuilderImpl<true> *pFStack_10;
  float element_local;
  FlatBufferBuilderImpl<true> *this_local;
  
  local_14 = element;
  pFStack_10 = this;
  AssertScalarT<float>(this);
  Align(this,4);
  local_18 = EndianScalar<float>(local_14);
  vector_downward<unsigned_long>::push_small<float>(&this->buf_,&local_18);
  tVar1 = CalculateOffset<unsigned_int>(this);
  return tVar1;
}

Assistant:

ReturnT PushElement(T element) {
    AssertScalarT<T>();
    Align(sizeof(T));
    buf_.push_small(EndianScalar(element));
    return CalculateOffset<ReturnT>();
  }